

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdEmuD3D56TlvUv::adjust_orig_mthd(MthdEmuD3D56TlvUv *this)

{
  mt19937 *this_00;
  byte *pbVar1;
  uint32_t *puVar2;
  bool bVar3;
  uint32_t uVar4;
  MthdTest *pMVar5;
  result_type rVar6;
  
  bVar3 = this->fin;
  if (bVar3 == true) {
    puVar2 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.notify;
    *(byte *)puVar2 = (byte)*puVar2 & 0xfe;
    uVar4 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.celsius_pipe_begin_end;
    if ((uVar4 == 10) || (uVar4 == 3)) {
      pbVar1 = (byte *)((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                               celsius_pipe_vtx_state + 3);
      *pbVar1 = *pbVar1 & 0x8f;
    }
  }
  if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x48 && bVar3 == true) {
    pMVar5 = &(this->super_SingleMthdTest).super_MthdTest;
    (pMVar5->super_StateTest).exp.valid[0] = 0;
    (pMVar5->super_StateTest).exp.valid[1] = 0;
  }
  this_00 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test
             .rnd;
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  if ((rVar6 & 1) != 0) {
    puVar2 = &(this->super_SingleMthdTest).super_MthdTest.val;
    *puVar2 = *puVar2 & 0xff800000;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    puVar2 = &(this->super_SingleMthdTest).super_MthdTest.val;
    *puVar2 = *puVar2 ^ 1 << ((byte)rVar6 & 0x1f);
  }
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (fin) {
			insrt(orig.notify, 0, 1, 0);
			adjust_orig_icmd(&orig);
		}
		if (cls == 0x48 && fin) {
			// XXX: test me
			exp.valid[0] = 0;
			exp.valid[1] = 0;
		}
		if (rnd() & 1) {
			insrt(val, 0, 23, 0);
			val ^= 1 << (rnd() & 0x1f);
		}
	}